

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O1

int X509_VERIFY_PARAM_add0_policy(X509_VERIFY_PARAM *param,ASN1_OBJECT *policy)

{
  long lVar1;
  OPENSSL_STACK *pOVar2;
  size_t sVar3;
  
  lVar1._0_4_ = param->purpose;
  lVar1._4_4_ = param->trust;
  if (lVar1 == 0) {
    pOVar2 = OPENSSL_sk_new_null();
    *(OPENSSL_STACK **)&param->purpose = pOVar2;
    if (pOVar2 == (OPENSSL_STACK *)0x0) {
      return 0;
    }
  }
  sVar3 = OPENSSL_sk_push(*(OPENSSL_STACK **)&param->purpose,policy);
  return (uint)(sVar3 != 0);
}

Assistant:

int X509_VERIFY_PARAM_add0_policy(X509_VERIFY_PARAM *param,
                                  ASN1_OBJECT *policy) {
  if (!param->policies) {
    param->policies = sk_ASN1_OBJECT_new_null();
    if (!param->policies) {
      return 0;
    }
  }
  if (!sk_ASN1_OBJECT_push(param->policies, policy)) {
    return 0;
  }
  return 1;
}